

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextRegionCommentDoc(Lexer *this)

{
  Lexer *in_RSI;
  char cVar1;
  Error<pfederc::LexerErrorCode> *local_40;
  Position local_38;
  
  nextChar(in_RSI);
  cVar1 = (char)in_RSI + -0x40;
  (in_RSI->lastComment)._M_string_length = 0;
  *(in_RSI->lastComment)._M_dataplus._M_p = '\0';
  while( true ) {
    while (in_RSI->currentChar == 0x2a) {
      nextChar(in_RSI);
      if (in_RSI->currentChar == 0x2f) {
        nextChar(in_RSI);
        nextToken(this);
        return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               this;
      }
      std::__cxx11::string::push_back(cVar1);
    }
    if (in_RSI->currentChar == -1) break;
    std::__cxx11::string::push_back(cVar1);
    nextChar(in_RSI);
  }
  getCurrentCursor(&local_38,in_RSI);
  local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
  local_40->logLevel = LVL_ERROR;
  local_40->err = LEX_ERR_REGION_COMMENT_END;
  (local_40->pos).line = local_38.line;
  (local_40->pos).startIndex = local_38.startIndex;
  (local_40->pos).endIndex = local_38.endIndex;
  (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                      *)in_RSI);
  if (local_40 == (Error<pfederc::LexerErrorCode> *)0x0) {
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
  std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
            ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_40,local_40);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextRegionCommentDoc() noexcept {
  nextChar();
  lastComment.clear();

  while (currentChar != EOF) {
    if (currentChar == '*') {
      nextChar(); // eat *
      if (currentChar == '/') {
        nextChar(); // eat /
        return nextToken();
      }

      lastComment += '*';
      continue;
    }

    lastComment += (char) currentChar;

    nextChar();
  }

  return generateError(std::make_unique<LexerError>(LVL_ERROR, LexerErrorCode::LEX_ERR_REGION_COMMENT_END,
    getCurrentCursor()));
}